

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

uint64_t pstore::milliseconds_since_epoch(void)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  if (-1000000 < lVar1) {
    return lVar1 / 1000000;
  }
  assert_failed("result >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/time.cpp"
                ,0x2c);
}

Assistant:

std::uint64_t milliseconds_since_epoch () {
        using namespace std::chrono;
        system_clock::duration const dur = system_clock::now ().time_since_epoch ();
        auto const ms = duration_cast<milliseconds> (dur);

        using rep = milliseconds::rep;
        using urep = std::make_unsigned<rep>::type;

        rep const result = ms.count ();
        PSTORE_ASSERT (result >= 0);

        static_assert (type_max<rep> () >= 0 &&
                           type_max<rep, urep> () <= type_max<std::uint64_t> (),
                       "millisecond representation is too wide for uint64");
        return static_cast<std::uint64_t> (result);
    }